

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O0

int __thiscall
deqp::gls::Functional::anon_unknown_0::FramebufferBlitCase::init
          (FramebufferBlitCase *this,EVP_PKEY_CTX *ctx)

{
  glBindRenderbufferFunc p_Var1;
  glFramebufferRenderbufferFunc p_Var2;
  glClearBufferfvFunc p_Var3;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  data;
  int iVar4;
  deUint32 dVar5;
  GLuint GVar6;
  int extraout_EAX;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  Functions *gl_00;
  MovePtr *this_01;
  ObjectWrapper *this_02;
  float *pfVar7;
  undefined8 in_stack_ffffffffffffff38;
  glBindFramebufferFunc p_Var8;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_> local_71;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  local_70;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  *local_60;
  undefined1 local_50 [8];
  Vec4 clearColor;
  Renderbuffer colorbuf;
  Functions *gl;
  FramebufferBlitCase *this_local;
  undefined4 extraout_var_00;
  
  iVar4 = (*((this->super_ScissorCase).m_renderCtx)->_vptr_RenderContext[4])();
  iVar4 = tcu::RenderTarget::getNumSamples((RenderTarget *)CONCAT44(extraout_var,iVar4));
  if (iVar4 != 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Cannot blit to multisampled framebuffer","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
               ,500);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  iVar4 = (*((this->super_ScissorCase).m_renderCtx)->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var_00,iVar4);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)(clearColor.m_data + 2),gl_00);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_50,1.0,0.5,0.125,1.0);
  this_01 = (MovePtr *)operator_new(0x18);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)this_01,gl_00);
  de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>::DefaultDeleter(&local_71);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             *)&local_70);
  local_60 = de::details::MovePtr::operator_cast_to_PtrData(&local_70,this_01);
  data._8_4_ = in_stack_ffffffffffffff40;
  data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)in_stack_ffffffffffffff38;
  data._12_4_ = in_stack_ffffffffffffff44;
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::operator=(&this->m_fbo,data);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
              *)&local_70);
  p_Var8 = gl_00->bindFramebuffer;
  this_02 = &de::details::
             UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             ::operator*(&(this->m_fbo).
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        )->super_ObjectWrapper;
  dVar5 = glu::ObjectWrapper::operator*(this_02);
  (*p_Var8)(0x8ca9,dVar5);
  p_Var1 = gl_00->bindRenderbuffer;
  dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)(clearColor.m_data + 2));
  (*p_Var1)(0x8d41,dVar5);
  (*gl_00->renderbufferStorage)(0x8d41,0x8058,0x40,0x40);
  p_Var2 = gl_00->framebufferRenderbuffer;
  dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)(clearColor.m_data + 2));
  (*p_Var2)(0x8ca9,0x8ce0,0x8d41,dVar5);
  p_Var3 = gl_00->clearBufferfv;
  pfVar7 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)local_50);
  (*p_Var3)(0x1800,0,pfVar7);
  p_Var8 = gl_00->bindFramebuffer;
  GVar6 = (*((this->super_ScissorCase).m_renderCtx)->_vptr_RenderContext[6])();
  (*p_Var8)(0x8ca9,GVar6);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)(clearColor.m_data + 2));
  return extraout_EAX;
}

Assistant:

void FramebufferBlitCase::init (void)
{
	if (m_renderCtx.getRenderTarget().getNumSamples())
		throw tcu::NotSupportedError("Cannot blit to multisampled framebuffer", "", __FILE__, __LINE__);

	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	const glu::Renderbuffer	colorbuf	(gl);
	const tcu::Vec4			clearColor	(1.0f, 0.5, 0.125f, 1.0f);

	m_fbo = FramebufferP(new glu::Framebuffer(gl));

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, **m_fbo);

	gl.bindRenderbuffer(GL_RENDERBUFFER, *colorbuf);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, SIZE, SIZE);
	gl.framebufferRenderbuffer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorbuf);

	gl.clearBufferfv(GL_COLOR, 0, clearColor.getPtr());
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_renderCtx.getDefaultFramebuffer());
}